

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

RotMat3x3d * __thiscall
OpenMD::StuntDouble::getA(RotMat3x3d *__return_storage_ptr__,StuntDouble *this)

{
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,
             (RectMatrix<double,_3U,_3U> *)
             ((long)this->localIndex_ * 0x48 +
             *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).aMat.
                              super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
  return __return_storage_ptr__;
}

Assistant:

RotMat3x3d getA() {
      return ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .aMat[localIndex_];
    }